

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O2

void S_PauseSound(bool notmusic,bool notsfx)

{
  if ((mus_playing.handle != (MusInfo *)0x0 && !notmusic) && (MusicPaused == '\0')) {
    (*(mus_playing.handle)->_vptr_MusInfo[5])();
    MusicPaused = '\x01';
  }
  if (notsfx) {
    return;
  }
  SoundPaused = 1;
  (*GSnd->_vptr_SoundRenderer[0x16])(GSnd,1,0);
  return;
}

Assistant:

void S_PauseSound (bool notmusic, bool notsfx)
{
	if (!notmusic && mus_playing.handle && !MusicPaused)
	{
		mus_playing.handle->Pause();
		MusicPaused = true;
	}
	if (!notsfx)
	{
		SoundPaused = true;
		GSnd->SetSfxPaused (true, 0);
	}
}